

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceArrayIntersectorKMB<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  Primitive_conflict4 *prim;
  AABBNodeMB4D *node1;
  ulong uVar23;
  byte bVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong *puVar28;
  undefined1 (*pauVar29) [32];
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  vbool<8>_conflict valid0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  vbool<8>_conflict local_274e;
  InstanceArrayIntersectorKMB<8> local_274d;
  uint local_274c;
  Precalculations local_2745;
  undefined4 local_2744;
  RayK<8> *local_2740;
  RayQueryContext *local_2738;
  Primitive_conflict4 *local_2730;
  long local_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2608[0] != 8) {
    auVar35 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar45 = ZEXT816(0) << 0x40;
    uVar30 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar45),5);
    uVar23 = vpcmpeqd_avx512vl(auVar35,(undefined1  [32])valid_i->field_0);
    uVar30 = uVar30 & uVar23;
    bVar24 = (byte)uVar30;
    if (bVar24 != 0) {
      auVar35 = *(undefined1 (*) [32])(ray + 0x80);
      auVar32 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar33 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37._16_4_ = 0x7fffffff;
      auVar37._20_4_ = 0x7fffffff;
      auVar37._24_4_ = 0x7fffffff;
      auVar37._28_4_ = 0x7fffffff;
      local_2740 = ray + 0x100;
      local_2744 = (undefined4)uVar30;
      auVar34 = vandps_avx(auVar35,auVar37);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      auVar40._16_4_ = 0x219392ef;
      auVar40._20_4_ = 0x219392ef;
      auVar40._24_4_ = 0x219392ef;
      auVar40._28_4_ = 0x219392ef;
      uVar23 = vcmpps_avx512vl(auVar34,auVar40,1);
      bVar4 = (bool)((byte)uVar23 & 1);
      auVar34._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._0_4_;
      bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar34._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._4_4_;
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar34._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._8_4_;
      bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar34._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._12_4_;
      bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
      auVar34._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._16_4_;
      bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
      auVar34._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._20_4_;
      bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
      auVar34._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._24_4_;
      bVar4 = SUB81(uVar23 >> 7,0);
      auVar34._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar35._28_4_;
      auVar35 = vandps_avx(auVar32,auVar37);
      uVar23 = vcmpps_avx512vl(auVar35,auVar40,1);
      bVar4 = (bool)((byte)uVar23 & 1);
      auVar36._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._0_4_;
      bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._4_4_;
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._8_4_;
      bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._12_4_;
      bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._16_4_;
      bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._20_4_;
      bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._24_4_;
      bVar4 = SUB81(uVar23 >> 7,0);
      auVar36._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar32._28_4_;
      auVar35 = vandps_avx(auVar33,auVar37);
      uVar23 = vcmpps_avx512vl(auVar35,auVar40,1);
      bVar4 = (bool)((byte)uVar23 & 1);
      auVar35._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._0_4_;
      bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._4_4_;
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._8_4_;
      bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._12_4_;
      bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
      auVar35._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._16_4_;
      bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
      auVar35._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._20_4_;
      bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
      auVar35._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._24_4_;
      bVar4 = SUB81(uVar23 >> 7,0);
      auVar35._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar33._28_4_;
      auVar32 = vrcp14ps_avx512vl(auVar34);
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = 0x3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      auVar38._16_4_ = 0x3f800000;
      auVar38._20_4_ = 0x3f800000;
      auVar38._24_4_ = 0x3f800000;
      auVar38._28_4_ = 0x3f800000;
      auVar13 = vfnmadd213ps_fma(auVar34,auVar32,auVar38);
      auVar33 = vrcp14ps_avx512vl(auVar36);
      auVar14 = vfnmadd213ps_fma(auVar36,auVar33,auVar38);
      auVar34 = vrcp14ps_avx512vl(auVar35);
      auVar15 = vfnmadd213ps_fma(auVar35,auVar34,auVar38);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar55 = ZEXT3264(local_1e80);
      auVar35 = *(undefined1 (*) [32])ray;
      auVar41._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar41._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar41._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar41._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar41._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar41._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar35 = *(undefined1 (*) [32])(ray + 0x20);
      auVar42._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar42._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar42._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar42._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar42._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar42._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar42._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar35 = *(undefined1 (*) [32])(ray + 0x40);
      auVar39._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar39._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar39._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar39._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar39._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar39._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar39._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar45));
      local_26c0._0_4_ = (uint)(bVar24 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar24 & 1) * 0x7f800000
      ;
      bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
      local_26c0._4_4_ = (uint)bVar4 * auVar35._4_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar30 >> 2) & 1);
      local_26c0._8_4_ = (uint)bVar4 * auVar35._8_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar30 >> 3) & 1);
      local_26c0._12_4_ = (uint)bVar4 * auVar35._12_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar30 >> 4) & 1);
      local_26c0._16_4_ = (uint)bVar4 * auVar35._16_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar30 >> 5) & 1);
      local_26c0._20_4_ = (uint)bVar4 * auVar35._20_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar30 >> 6) & 1);
      local_26c0._24_4_ = (uint)bVar4 * auVar35._24_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = SUB81(uVar30 >> 7,0);
      local_26c0._28_4_ = (uint)bVar4 * auVar35._28_4_ | (uint)!bVar4 * 0x7f800000;
      auVar56 = ZEXT3264(local_26c0);
      auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar33,auVar33);
      auVar53 = ZEXT1664(auVar14);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar33 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar45));
      bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar10 = SUB81(uVar30 >> 7,0);
      auVar57 = ZEXT3264(CONCAT428((uint)bVar10 * auVar33._28_4_ | (uint)!bVar10 * auVar35._28_4_,
                                   CONCAT424((uint)bVar9 * auVar33._24_4_ |
                                             (uint)!bVar9 * auVar35._24_4_,
                                             CONCAT420((uint)bVar8 * auVar33._20_4_ |
                                                       (uint)!bVar8 * auVar35._20_4_,
                                                       CONCAT416((uint)bVar7 * auVar33._16_4_ |
                                                                 (uint)!bVar7 * auVar35._16_4_,
                                                                 CONCAT412((uint)bVar6 *
                                                                           auVar33._12_4_ |
                                                                           (uint)!bVar6 *
                                                                           auVar35._12_4_,
                                                                           CONCAT48((uint)bVar5 *
                                                                                    auVar33._8_4_ |
                                                                                    (uint)!bVar5 *
                                                                                    auVar35._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar4 * auVar33._4_4_ |
                                                  (uint)!bVar4 * auVar35._4_4_,
                                                  (uint)(bVar24 & 1) * auVar33._0_4_ |
                                                  (uint)!(bool)(bVar24 & 1) * auVar35._0_4_))))))));
      auVar45 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar32,auVar32);
      auVar52 = ZEXT1664(auVar45);
      auVar13 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar34,auVar34);
      auVar54 = ZEXT1664(auVar13);
      local_274c = (uint)(byte)~bVar24;
      puVar28 = local_2608 + 1;
      pauVar29 = (undefined1 (*) [32])local_1e40;
      local_2610 = 0xfffffffffffffff8;
      local_1e60 = local_26c0;
      local_2660 = ZEXT1632(auVar45);
      local_26e0 = vmulps_avx512vl(local_2660,auVar41);
      auVar58 = ZEXT3264(local_26e0);
      local_2680 = ZEXT1632(auVar14);
      local_2700 = vmulps_avx512vl(local_2680,auVar42);
      auVar59 = ZEXT3264(local_2700);
      local_26a0 = ZEXT1632(auVar13);
      local_2720 = vmulps_avx512vl(local_26a0,auVar39);
      auVar60 = ZEXT3264(local_2720);
      local_2738 = context;
LAB_01d17b54:
      uVar30 = puVar28[-1];
      bVar24 = (byte)local_274c;
      if (uVar30 != 0xfffffffffffffff8) {
        puVar28 = puVar28 + -1;
        pauVar1 = pauVar29 + -1;
        pauVar29 = pauVar29 + -1;
        local_2640 = auVar57._0_32_;
        uVar11 = vcmpps_avx512vl(*pauVar1,local_2640,1);
        auVar35 = *pauVar1;
        if ((char)uVar11 != '\0') {
          do {
            uVar27 = (uint)uVar30;
            if ((uVar30 & 8) != 0) {
              if (uVar30 == 0xfffffffffffffff8) goto LAB_01d17e0f;
              uVar11 = vcmpps_avx512vl(local_2640,auVar35,6);
              if ((char)uVar11 != '\0') {
                local_2730 = (Primitive_conflict4 *)(uVar30 & 0xfffffffffffffff0);
                local_274e.v = ~bVar24;
                local_2728 = (ulong)(uVar27 & 0xf) - 7;
                goto LAB_01d17d40;
              }
              break;
            }
            uVar23 = uVar30 & 0xfffffffffffffff0;
            uVar30 = 8;
            auVar32 = auVar55._0_32_;
            for (lVar25 = -0x10;
                (lVar25 != 0 && (uVar3 = *(ulong *)(uVar23 + 0x20 + lVar25 * 2), uVar3 != 8));
                lVar25 = lVar25 + 4) {
              uVar2 = *(undefined4 *)(uVar23 + 0x90 + lVar25);
              auVar46._4_4_ = uVar2;
              auVar46._0_4_ = uVar2;
              auVar46._8_4_ = uVar2;
              auVar46._12_4_ = uVar2;
              auVar46._16_4_ = uVar2;
              auVar46._20_4_ = uVar2;
              auVar46._24_4_ = uVar2;
              auVar46._28_4_ = uVar2;
              auVar33 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar2 = *(undefined4 *)(uVar23 + 0x30 + lVar25);
              auVar43._4_4_ = uVar2;
              auVar43._0_4_ = uVar2;
              auVar43._8_4_ = uVar2;
              auVar43._12_4_ = uVar2;
              auVar43._16_4_ = uVar2;
              auVar43._20_4_ = uVar2;
              auVar43._24_4_ = uVar2;
              auVar43._28_4_ = uVar2;
              auVar34 = vfmadd213ps_avx512vl(auVar46,auVar33,auVar43);
              uVar2 = *(undefined4 *)(uVar23 + 0xb0 + lVar25);
              auVar47._4_4_ = uVar2;
              auVar47._0_4_ = uVar2;
              auVar47._8_4_ = uVar2;
              auVar47._12_4_ = uVar2;
              auVar47._16_4_ = uVar2;
              auVar47._20_4_ = uVar2;
              auVar47._24_4_ = uVar2;
              auVar47._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0x50 + lVar25);
              auVar16._4_4_ = uVar2;
              auVar16._0_4_ = uVar2;
              auVar16._8_4_ = uVar2;
              auVar16._12_4_ = uVar2;
              auVar16._16_4_ = uVar2;
              auVar16._20_4_ = uVar2;
              auVar16._24_4_ = uVar2;
              auVar16._28_4_ = uVar2;
              auVar36 = vfmadd213ps_avx512vl(auVar47,auVar33,auVar16);
              uVar2 = *(undefined4 *)(uVar23 + 0xd0 + lVar25);
              auVar48._4_4_ = uVar2;
              auVar48._0_4_ = uVar2;
              auVar48._8_4_ = uVar2;
              auVar48._12_4_ = uVar2;
              auVar48._16_4_ = uVar2;
              auVar48._20_4_ = uVar2;
              auVar48._24_4_ = uVar2;
              auVar48._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0x70 + lVar25);
              auVar17._4_4_ = uVar2;
              auVar17._0_4_ = uVar2;
              auVar17._8_4_ = uVar2;
              auVar17._12_4_ = uVar2;
              auVar17._16_4_ = uVar2;
              auVar17._20_4_ = uVar2;
              auVar17._24_4_ = uVar2;
              auVar17._28_4_ = uVar2;
              auVar37 = vfmadd213ps_avx512vl(auVar48,auVar33,auVar17);
              uVar2 = *(undefined4 *)(uVar23 + 0xa0 + lVar25);
              auVar49._4_4_ = uVar2;
              auVar49._0_4_ = uVar2;
              auVar49._8_4_ = uVar2;
              auVar49._12_4_ = uVar2;
              auVar49._16_4_ = uVar2;
              auVar49._20_4_ = uVar2;
              auVar49._24_4_ = uVar2;
              auVar49._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0x40 + lVar25);
              auVar18._4_4_ = uVar2;
              auVar18._0_4_ = uVar2;
              auVar18._8_4_ = uVar2;
              auVar18._12_4_ = uVar2;
              auVar18._16_4_ = uVar2;
              auVar18._20_4_ = uVar2;
              auVar18._24_4_ = uVar2;
              auVar18._28_4_ = uVar2;
              auVar38 = vfmadd213ps_avx512vl(auVar49,auVar33,auVar18);
              uVar2 = *(undefined4 *)(uVar23 + 0xc0 + lVar25);
              auVar50._4_4_ = uVar2;
              auVar50._0_4_ = uVar2;
              auVar50._8_4_ = uVar2;
              auVar50._12_4_ = uVar2;
              auVar50._16_4_ = uVar2;
              auVar50._20_4_ = uVar2;
              auVar50._24_4_ = uVar2;
              auVar50._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0x60 + lVar25);
              auVar19._4_4_ = uVar2;
              auVar19._0_4_ = uVar2;
              auVar19._8_4_ = uVar2;
              auVar19._12_4_ = uVar2;
              auVar19._16_4_ = uVar2;
              auVar19._20_4_ = uVar2;
              auVar19._24_4_ = uVar2;
              auVar19._28_4_ = uVar2;
              auVar39 = vfmadd213ps_avx512vl(auVar50,auVar33,auVar19);
              uVar2 = *(undefined4 *)(uVar23 + 0xe0 + lVar25);
              auVar51._4_4_ = uVar2;
              auVar51._0_4_ = uVar2;
              auVar51._8_4_ = uVar2;
              auVar51._12_4_ = uVar2;
              auVar51._16_4_ = uVar2;
              auVar51._20_4_ = uVar2;
              auVar51._24_4_ = uVar2;
              auVar51._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar23 + 0x80 + lVar25);
              auVar20._4_4_ = uVar2;
              auVar20._0_4_ = uVar2;
              auVar20._8_4_ = uVar2;
              auVar20._12_4_ = uVar2;
              auVar20._16_4_ = uVar2;
              auVar20._20_4_ = uVar2;
              auVar20._24_4_ = uVar2;
              auVar20._28_4_ = uVar2;
              auVar40 = vfmadd213ps_avx512vl(auVar51,auVar33,auVar20);
              auVar41 = vfmadd213ps_avx512vl(auVar34,auVar52._0_32_,auVar58._0_32_);
              auVar42 = vfmadd213ps_avx512vl(auVar36,auVar53._0_32_,auVar59._0_32_);
              auVar43 = vfmadd213ps_avx512vl(auVar37,auVar54._0_32_,auVar60._0_32_);
              auVar37 = vfmadd213ps_avx512vl(auVar38,auVar52._0_32_,auVar58._0_32_);
              auVar38 = vfmadd213ps_avx512vl(auVar39,auVar53._0_32_,auVar59._0_32_);
              auVar39 = vfmadd213ps_avx512vl(auVar40,auVar54._0_32_,auVar60._0_32_);
              auVar34 = vpminsd_avx2(auVar41,auVar37);
              auVar36 = vpminsd_avx2(auVar42,auVar38);
              auVar34 = vpmaxsd_avx2(auVar34,auVar36);
              auVar36 = vpminsd_avx2(auVar43,auVar39);
              auVar34 = vpmaxsd_avx2(auVar34,auVar36);
              auVar36 = vpmaxsd_avx2(auVar41,auVar37);
              auVar37 = vpmaxsd_avx2(auVar42,auVar38);
              auVar38 = vpminsd_avx2(auVar36,auVar37);
              auVar36 = vpmaxsd_avx2(auVar43,auVar39);
              auVar37 = vpmaxsd_avx2(auVar34,auVar56._0_32_);
              auVar36 = vpminsd_avx512vl(auVar36,local_2640);
              auVar36 = vpminsd_avx2(auVar38,auVar36);
              uVar31 = vcmpps_avx512vl(auVar37,auVar36,2);
              if ((uVar27 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar23 + 0xf0 + lVar25);
                auVar21._4_4_ = uVar2;
                auVar21._0_4_ = uVar2;
                auVar21._8_4_ = uVar2;
                auVar21._12_4_ = uVar2;
                auVar21._16_4_ = uVar2;
                auVar21._20_4_ = uVar2;
                auVar21._24_4_ = uVar2;
                auVar21._28_4_ = uVar2;
                uVar26 = vcmpps_avx512vl(auVar33,auVar21,0xd);
                uVar2 = *(undefined4 *)(uVar23 + 0x100 + lVar25);
                auVar22._4_4_ = uVar2;
                auVar22._0_4_ = uVar2;
                auVar22._8_4_ = uVar2;
                auVar22._12_4_ = uVar2;
                auVar22._16_4_ = uVar2;
                auVar22._20_4_ = uVar2;
                auVar22._24_4_ = uVar2;
                auVar22._28_4_ = uVar2;
                uVar12 = vcmpps_avx512vl(auVar33,auVar22,1);
                uVar31 = uVar31 & uVar26 & uVar12;
              }
              uVar26 = vcmpps_avx512vl(local_2640,auVar35,6);
              uVar31 = uVar31 & uVar26;
              uVar26 = uVar30;
              auVar44 = auVar32;
              if ((byte)uVar31 != 0) {
                auVar34 = vblendmps_avx512vl(auVar55._0_32_,auVar34);
                bVar4 = (bool)((byte)uVar31 & 1);
                auVar44._0_4_ = (uint)bVar4 * auVar34._0_4_ | (uint)!bVar4 * auVar33._0_4_;
                bVar4 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * auVar33._4_4_;
                bVar4 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * auVar33._8_4_;
                bVar4 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar44._12_4_ = (uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * auVar33._12_4_;
                bVar4 = (bool)((byte)(uVar31 >> 4) & 1);
                auVar44._16_4_ = (uint)bVar4 * auVar34._16_4_ | (uint)!bVar4 * auVar33._16_4_;
                bVar4 = (bool)((byte)(uVar31 >> 5) & 1);
                auVar44._20_4_ = (uint)bVar4 * auVar34._20_4_ | (uint)!bVar4 * auVar33._20_4_;
                bVar4 = (bool)((byte)(uVar31 >> 6) & 1);
                auVar44._24_4_ = (uint)bVar4 * auVar34._24_4_ | (uint)!bVar4 * auVar33._24_4_;
                bVar4 = SUB81(uVar31 >> 7,0);
                auVar44._28_4_ = (uint)bVar4 * auVar34._28_4_ | (uint)!bVar4 * auVar33._28_4_;
                uVar26 = uVar3;
                if (uVar30 != 8) {
                  *puVar28 = uVar30;
                  puVar28 = puVar28 + 1;
                  *pauVar29 = auVar32;
                  pauVar29 = pauVar29 + 1;
                }
              }
              auVar32 = auVar44;
              uVar30 = uVar26;
            }
            auVar35 = auVar32;
          } while (uVar30 != 8);
        }
        goto LAB_01d17b54;
      }
LAB_01d17e0f:
      bVar24 = bVar24 & (byte)local_2744;
      bVar4 = (bool)(bVar24 >> 1 & 1);
      bVar5 = (bool)(bVar24 >> 2 & 1);
      bVar6 = (bool)(bVar24 >> 3 & 1);
      bVar7 = (bool)(bVar24 >> 4 & 1);
      bVar8 = (bool)(bVar24 >> 5 & 1);
      bVar9 = (bool)(bVar24 >> 6 & 1);
      *(uint *)local_2740 =
           (uint)(bVar24 & 1) * -0x800000 | (uint)!(bool)(bVar24 & 1) * *(int *)local_2740;
      *(uint *)(local_2740 + 4) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_2740 + 4);
      *(uint *)(local_2740 + 8) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_2740 + 8);
      *(uint *)(local_2740 + 0xc) =
           (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_2740 + 0xc);
      *(uint *)(local_2740 + 0x10) =
           (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_2740 + 0x10);
      *(uint *)(local_2740 + 0x14) =
           (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_2740 + 0x14);
      *(uint *)(local_2740 + 0x18) =
           (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_2740 + 0x18);
      *(uint *)(local_2740 + 0x1c) =
           (uint)(bVar24 >> 7) * -0x800000 |
           (uint)!(bool)(bVar24 >> 7) * *(int *)(local_2740 + 0x1c);
    }
  }
  return;
  while( true ) {
    prim = local_2730;
    local_2730 = local_2730 + 1;
    InstanceArrayIntersectorKMB<8>::occluded
              (&local_274d,&local_274e,&local_2745,ray,local_2738,prim);
    auVar60 = ZEXT3264(local_2720);
    auVar59 = ZEXT3264(local_2700);
    auVar58 = ZEXT3264(local_26e0);
    auVar57 = ZEXT3264(local_2640);
    auVar56 = ZEXT3264(local_26c0);
    auVar55 = ZEXT3264(CONCAT428(0x7f800000,
                                 CONCAT424(0x7f800000,
                                           CONCAT420(0x7f800000,
                                                     CONCAT416(0x7f800000,
                                                               CONCAT412(0x7f800000,
                                                                         CONCAT48(0x7f800000,
                                                                                  0x7f8000007f800000
                                                                                 )))))));
    auVar54 = ZEXT3264(local_26a0);
    auVar53 = ZEXT3264(local_2680);
    auVar52 = ZEXT3264(local_2660);
    local_274e.v = ~(byte)local_274d & local_274e.v;
    if (local_274e.v == 0) break;
LAB_01d17d40:
    local_2728 = local_2728 + -1;
    auVar35 = auVar57._0_32_;
    if (local_2728 == 0) goto LAB_01d17de3;
  }
  local_274e.v = 0;
  auVar35 = local_2640;
LAB_01d17de3:
  bVar24 = (byte)local_274c | ~local_274e.v;
  local_274c = CONCAT31((int3)(local_274c >> 8),bVar24);
  if (bVar24 == 0xff) {
    bVar24 = 0xff;
    goto LAB_01d17e0f;
  }
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar4 = (bool)((byte)(local_274c >> 1) & 1);
  bVar5 = (bool)((byte)(local_274c >> 2) & 1);
  bVar6 = (bool)((byte)(local_274c >> 3) & 1);
  bVar7 = (bool)((byte)(local_274c >> 4) & 1);
  bVar8 = (bool)((byte)(local_274c >> 5) & 1);
  bVar9 = (bool)((byte)(local_274c >> 6) & 1);
  bVar10 = (bool)((byte)(local_274c >> 7) & 1);
  auVar57 = ZEXT3264(CONCAT428((uint)bVar10 * auVar32._28_4_ | (uint)!bVar10 * auVar35._28_4_,
                               CONCAT424((uint)bVar9 * auVar32._24_4_ |
                                         (uint)!bVar9 * auVar35._24_4_,
                                         CONCAT420((uint)bVar8 * auVar32._20_4_ |
                                                   (uint)!bVar8 * auVar35._20_4_,
                                                   CONCAT416((uint)bVar7 * auVar32._16_4_ |
                                                             (uint)!bVar7 * auVar35._16_4_,
                                                             CONCAT412((uint)bVar6 * auVar32._12_4_
                                                                       | (uint)!bVar6 *
                                                                         auVar35._12_4_,
                                                                       CONCAT48((uint)bVar5 *
                                                                                auVar32._8_4_ |
                                                                                (uint)!bVar5 *
                                                                                auVar35._8_4_,
                                                                                CONCAT44((uint)bVar4
                                                                                         * auVar32.
                                                  _4_4_ | (uint)!bVar4 * auVar35._4_4_,
                                                  (uint)(bVar24 & 1) * auVar32._0_4_ |
                                                  (uint)!(bool)(bVar24 & 1) * auVar35._0_4_))))))));
  goto LAB_01d17b54;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }